

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

void __thiscall CVmTimeZoneCache::~CVmTimeZoneCache(CVmTimeZoneCache *this)

{
  CVmHashTable *pCVar1;
  CVmTimeZone *this_00;
  
  pCVar1 = this->db_tab_;
  if (pCVar1 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar1);
    operator_delete(pCVar1,0x20);
  }
  pCVar1 = this->synth_tab_;
  if (pCVar1 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar1);
    operator_delete(pCVar1,0x20);
  }
  pCVar1 = this->abbr_tab_;
  if (pCVar1 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar1);
    operator_delete(pCVar1,0x20);
  }
  if (this->local_zone_name_ != (char *)0x0) {
    operator_delete__(this->local_zone_name_);
  }
  this_00 = this->local_zone_;
  if (this_00 != (CVmTimeZone *)0x0) {
    CVmTimeZone::~CVmTimeZone(this_00);
    operator_delete(this_00,0x68);
  }
  if (this->zone_bytes_ != (char *)0x0) {
    operator_delete__(this->zone_bytes_);
  }
  if (this->link_bytes_ != (char *)0x0) {
    operator_delete__(this->link_bytes_);
  }
  if (this->abbr_bytes_ != (char *)0x0) {
    operator_delete__(this->abbr_bytes_);
    return;
  }
  return;
}

Assistant:

CVmTimeZoneCache::~CVmTimeZoneCache()
{
    /* delete our zone table, zone index, and abbreviation table */
    if (db_tab_ != 0)
        delete db_tab_;
    if (synth_tab_ != 0)
        delete synth_tab_;
    if (abbr_tab_ != 0)
        delete abbr_tab_;

    /* delete the local zone name, if set */
    if (local_zone_name_ != 0)
        delete [] local_zone_name_;

    /* if we have a local zone object, delete it */
    if (local_zone_ != 0)
        delete local_zone_;

    /* if we loaded the file data sections, delete them */
    if (zone_bytes_ != 0)
        delete [] zone_bytes_;
    if (link_bytes_ != 0)
        delete [] link_bytes_;
    if (abbr_bytes_ != 0)
        delete [] abbr_bytes_;
}